

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign.cpp
# Opt level: O3

int __thiscall
ncnn::ROIAlign::forward
          (ROIAlign *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint _c;
  pointer pMVar6;
  Mat *this_00;
  void *pvVar7;
  size_t sVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined4 uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  int iVar30;
  float fVar31;
  float fVar32;
  undefined1 in_XMM1 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  float fVar47;
  int local_150;
  void *local_148;
  void *local_138;
  ulong local_130;
  ulong local_f0;
  ulong local_c8;
  Allocator *_allocator;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = pMVar6->w;
  iVar5 = pMVar6->h;
  _c = pMVar6->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _allocator = opt->blob_allocator;
  Mat::create(this_00,this->pooled_width,this->pooled_height,_c,pMVar6->elemsize,_allocator);
  uVar21 = SUB84(_allocator,0);
  pvVar7 = this_00->data;
  iVar18 = -100;
  if ((pvVar7 != (void *)0x0) && (sVar8 = this_00->cstep, (long)this_00->c * sVar8 != 0)) {
    fVar35 = this->spatial_scale;
    auVar46._0_8_ = *pMVar6[1].data;
    uVar2 = *(undefined8 *)((long)pMVar6[1].data + 8);
    fVar38 = (float)auVar46._0_8_ * fVar35;
    fVar40 = (float)((ulong)auVar46._0_8_ >> 0x20) * fVar35;
    auVar46._0_8_ =
         CONCAT44((float)((ulong)uVar2 >> 0x20) * fVar35 - fVar40,(float)uVar2 * fVar35 - fVar38);
    auVar46._8_4_ = fVar35 * 0.0 - fVar35 * 0.0;
    auVar46._12_4_ = fVar35 * 0.0 - fVar35 * 0.0;
    if (this->aligned == true) {
      fVar38 = fVar38 + -0.5;
      fVar40 = fVar40 + -0.5;
    }
    else {
      auVar46 = maxps(auVar46,_DAT_005530f0);
    }
    uVar3._0_4_ = this->pooled_width;
    uVar3._4_4_ = this->pooled_height;
    auVar33._4_4_ = (float)(int)uVar3._4_4_;
    auVar33._0_4_ = (float)(int)(undefined4)uVar3;
    auVar33._8_8_ = 0;
    auVar33 = rcpps(in_XMM1,auVar33);
    fVar35 = (float)auVar46._0_8_ * auVar33._0_4_;
    fVar31 = (float)((ulong)auVar46._0_8_ >> 0x20);
    fVar37 = fVar31 * auVar33._4_4_;
    fVar35 = ((float)auVar46._0_8_ - (float)(int)(undefined4)uVar3 * fVar35) * auVar33._0_4_ +
             fVar35;
    fVar37 = (fVar31 - (float)(int)uVar3._4_4_ * fVar37) * auVar33._4_4_ + fVar37;
    if (this->version == 1) {
      if (this->sampling_ratio < 1) {
        fVar47 = ceilf(fVar35);
        fVar31 = ceilf(fVar37);
      }
      else {
        fVar47 = (float)this->sampling_ratio;
        fVar31 = fVar47;
      }
      if ((int)_c < 1) {
        return 0;
      }
      iVar30 = (int)fVar47;
      iVar13 = (int)fVar31;
      iVar18 = 1;
      if (1 < iVar30 * iVar13) {
        iVar18 = iVar30 * iVar13;
      }
      pvVar9 = pMVar6->data;
      sVar10 = pMVar6->cstep;
      sVar11 = pMVar6->elemsize;
      sVar12 = this_00->elemsize;
      auVar34._0_4_ = -(uint)(0 < iVar30);
      auVar34._4_4_ = -(uint)(0 < iVar30);
      auVar34._8_4_ = -(uint)(0 < iVar13);
      auVar34._12_4_ = -(uint)(0 < iVar13);
      uVar23 = movmskpd(uVar21,auVar34);
      local_c8 = 0;
      do {
        if (0 < (int)uVar3._4_4_) {
          lVar25 = sVar10 * sVar11 * local_c8;
          local_148 = (void *)(sVar8 * sVar12 * local_c8 + (long)pvVar7);
          local_150 = 0;
          do {
            if (0 < (int)(undefined4)uVar3) {
              local_130 = 0;
              do {
                fVar31 = 0.0;
                if ((byte)((byte)uVar23 >> 1) != 0) {
                  iVar14 = 0;
                  do {
                    if ((uVar23 & 1) != 0) {
                      fVar47 = ((float)iVar14 + 0.5) * fVar37 * (1.0 / (float)iVar13) +
                               (float)local_150 * fVar37 + fVar40;
                      iVar19 = 0;
                      do {
                        if ((((-1.0 <= fVar47) && (fVar47 <= (float)iVar5)) &&
                            (fVar26 = ((float)iVar19 + 0.5) * fVar35 * (1.0 / (float)iVar30) +
                                      (float)(int)local_130 * fVar35 + fVar38, -1.0 <= fVar26)) &&
                           (fVar26 <= (float)iVar4)) {
                          fVar32 = 0.0;
                          if (fVar47 <= 0.0) {
                            fVar47 = 0.0;
                          }
                          if (fVar26 <= 0.0) {
                            fVar26 = 0.0;
                          }
                          iVar24 = (int)fVar26;
                          iVar22 = iVar24 + 1;
                          iVar20 = (int)fVar47 + 1;
                          if (iVar22 < iVar4) {
                            fVar36 = fVar26 - (float)(int)fVar26;
                            if (iVar22 < iVar4) goto LAB_0043f3ac;
LAB_0043f3cc:
                            fVar26 = 1.0;
                          }
                          else {
                            fVar36 = 0.0;
                            if (iVar4 <= iVar22) goto LAB_0043f3cc;
LAB_0043f3ac:
                            fVar26 = (float)iVar22 - fVar26;
                          }
                          if (iVar4 <= iVar22) {
                            iVar22 = iVar4 + -1;
                          }
                          if (iVar20 < iVar5) {
                            fVar27 = (float)iVar20 - fVar47;
                            fVar32 = fVar47 - (float)(int)fVar47;
                          }
                          else {
                            fVar27 = 1.0;
                            iVar20 = iVar5 + -1;
                          }
                          iVar15 = (int)fVar47 * iVar4;
                          fVar31 = (*(float *)((long)pvVar9 + (long)(iVar15 + iVar22) * 4 + lVar25)
                                    * fVar36 +
                                   *(float *)((long)pvVar9 + (long)(iVar15 + iVar24) * 4 + lVar25) *
                                   fVar26) * fVar27 + fVar31 +
                                   (fVar36 * *(float *)((long)pvVar9 +
                                                       (long)(iVar20 * iVar4 + iVar22) * 4 + lVar25)
                                   + fVar26 * *(float *)((long)pvVar9 +
                                                        (long)(iVar24 + iVar20 * iVar4) * 4 + lVar25
                                                        )) * fVar32;
                        }
                        iVar19 = iVar19 + 1;
                      } while (iVar30 != iVar19);
                    }
                    iVar14 = iVar14 + 1;
                  } while (iVar14 != iVar13);
                }
                *(float *)((long)local_148 + local_130 * 4) = fVar31 * (1.0 / (float)iVar18);
                local_130 = local_130 + 1;
              } while (local_130 != (uVar3 & 0xffffffff));
            }
            local_148 = (void *)((long)local_148 + (long)(int)(undefined4)uVar3 * 4);
            local_150 = local_150 + 1;
          } while (local_150 != uVar3._4_4_);
        }
        local_c8 = local_c8 + 1;
      } while (local_c8 != _c);
    }
    else {
      if (this->version != 0) {
        return 0;
      }
      if ((int)_c < 1) {
        return 0;
      }
      pvVar9 = pMVar6->data;
      sVar10 = pMVar6->cstep;
      sVar11 = pMVar6->elemsize;
      sVar12 = this_00->elemsize;
      fVar31 = (float)iVar5;
      fVar47 = (float)iVar4;
      local_f0 = 0;
      do {
        if (0 < (int)uVar3._4_4_) {
          lVar25 = sVar10 * sVar11 * local_f0;
          local_138 = (void *)(sVar8 * sVar12 * local_f0 + (long)pvVar7);
          iVar18 = this->sampling_ratio;
          fVar26 = (float)iVar18;
          iVar30 = 0;
          do {
            if (0 < (int)(undefined4)uVar3) {
              fVar32 = (float)iVar30 * fVar37 + fVar40;
              fVar36 = (float)(iVar30 + 1) * fVar37 + fVar40;
              if (fVar32 <= 0.0) {
                fVar32 = 0.0;
              }
              if (fVar31 <= fVar32) {
                fVar32 = fVar31;
              }
              if (fVar36 <= 0.0) {
                fVar36 = 0.0;
              }
              if (fVar31 <= fVar36) {
                fVar36 = fVar31;
              }
              fVar27 = ceilf(fVar36 - fVar32);
              uVar16 = 0;
              do {
                uVar1 = uVar16 + 1;
                fVar45 = (float)(int)uVar16 * fVar35 + fVar38;
                fVar39 = (float)(int)uVar1 * fVar35 + fVar38;
                if (fVar45 <= 0.0) {
                  fVar45 = 0.0;
                }
                if (fVar47 <= fVar45) {
                  fVar45 = fVar47;
                }
                if (fVar39 <= 0.0) {
                  fVar39 = 0.0;
                }
                if (fVar47 <= fVar39) {
                  fVar39 = fVar47;
                }
                fVar28 = fVar26;
                fVar29 = fVar26;
                if (iVar18 < 1) {
                  fVar28 = ceilf(fVar39 - fVar45);
                  fVar29 = fVar27;
                }
                iVar13 = (int)fVar29;
                iVar14 = (int)fVar28;
                fVar29 = 0.0;
                fVar28 = 0.0;
                if (0 < iVar13) {
                  fVar28 = 0.0;
                  iVar19 = 0;
                  do {
                    if (0 < iVar14) {
                      fVar41 = ((float)iVar19 + 0.5) * fVar37 * (1.0 / (float)iVar13) + fVar32;
                      iVar22 = (int)fVar41 + 1;
                      if (iVar22 < iVar5) {
                        fVar43 = (float)iVar22 - fVar41;
                        if (iVar22 < iVar5) goto LAB_0043ef71;
LAB_0043ef94:
                        fVar42 = 0.0;
                      }
                      else {
                        fVar43 = 1.0;
                        if (iVar5 <= iVar22) goto LAB_0043ef94;
LAB_0043ef71:
                        fVar42 = fVar41 - (float)(int)fVar41;
                      }
                      if (iVar5 <= iVar22) {
                        iVar22 = iVar5 + -1;
                      }
                      iVar20 = (int)fVar41 * iVar4;
                      iVar24 = 0;
                      do {
                        fVar41 = ((float)iVar24 + 0.5) * fVar35 * (1.0 / (float)iVar14) + fVar45;
                        iVar17 = (int)fVar41;
                        iVar15 = iVar17 + 1;
                        if (iVar15 < iVar4) {
                          fVar44 = fVar41 - (float)(int)fVar41;
                          if (iVar4 <= iVar15) goto LAB_0043efda;
LAB_0043eff2:
                          fVar41 = (float)iVar15 - fVar41;
                        }
                        else {
                          fVar44 = 0.0;
                          if (iVar15 < iVar4) goto LAB_0043eff2;
LAB_0043efda:
                          fVar41 = 1.0;
                        }
                        if (iVar4 <= iVar15) {
                          iVar15 = iVar4 + -1;
                        }
                        fVar28 = (fVar44 * *(float *)((long)pvVar9 +
                                                     (long)(iVar15 + iVar22 * iVar4) * 4 + lVar25) +
                                 fVar41 * *(float *)((long)pvVar9 +
                                                    (long)(iVar17 + iVar22 * iVar4) * 4 + lVar25)) *
                                 fVar42 + fVar28 + (*(float *)((long)pvVar9 +
                                                              (long)(iVar15 + iVar20) * 4 + lVar25)
                                                    * fVar44 +
                                                   *(float *)((long)pvVar9 +
                                                             (long)(iVar20 + iVar17) * 4 + lVar25) *
                                                   fVar41) * fVar43;
                        iVar24 = iVar24 + 1;
                      } while (iVar14 != iVar24);
                    }
                    iVar19 = iVar19 + 1;
                  } while (iVar19 != iVar13);
                }
                if (fVar32 < fVar36 && fVar45 < fVar39) {
                  fVar29 = fVar28 / (float)(iVar14 * iVar13);
                }
                *(float *)((long)local_138 + uVar16 * 4) = fVar29;
                uVar16 = uVar1;
              } while (uVar1 != (uVar3 & 0xffffffff));
            }
            iVar30 = iVar30 + 1;
            local_138 = (void *)((long)local_138 + (long)(int)(undefined4)uVar3 * 4);
          } while (iVar30 != uVar3._4_4_);
        }
        local_f0 = local_f0 + 1;
      } while (local_f0 != _c);
    }
    iVar18 = 0;
  }
  return iVar18;
}

Assistant:

int ROIAlign::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: avg pool over R
    const float* roi_ptr = roi_blob;

    float roi_x1 = roi_ptr[0] * spatial_scale;
    float roi_y1 = roi_ptr[1] * spatial_scale;
    float roi_x2 = roi_ptr[2] * spatial_scale;
    float roi_y2 = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_x1 -= 0.5f;
        roi_y1 -= 0.5f;
        roi_x2 -= 0.5f;
        roi_y2 -= 0.5f;
    }

    float roi_w = roi_x2 - roi_x1;
    float roi_h = roi_y2 - roi_y1;

    if (!aligned)
    {
        roi_w = std::max(roi_w, 1.f);
        roi_h = std::max(roi_h, 1.f);
    }

    float bin_size_w = roi_w / (float)pooled_width;
    float bin_size_h = roi_h / (float)pooled_height;

    if (version == 0)
    {
        // original version
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_y1 + ph * bin_size_h;
                    float wstart = roi_x1 + pw * bin_size_w;
                    float hend = roi_y1 + (ph + 1) * bin_size_h;
                    float wend = roi_x1 + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)h);
                    wstart = std::min(std::max(wstart, 0.f), (float)w);
                    hend = std::min(std::max(hend, 0.f), (float)h);
                    wend = std::min(std::max(wend, 0.f), (float)w);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        float y = hstart + (by + 0.5f) * bin_size_h / (float)bin_grid_h;

                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            float x = wstart + (bx + 0.5f) * bin_size_w / (float)bin_grid_w;

                            // bilinear interpolate at (x,y)
                            float v = bilinear_interpolate(ptr, w, h, x, y);

                            sum += v;
                        }
                    }

                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_h / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_w / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float sum = 0.f;
                    for (int by = 0; by < roi_bin_grid_h; by++)
                    {
                        float y = roi_y1 + ph * bin_size_h + (by + 0.5f) * bin_size_h / (float)roi_bin_grid_h;

                        for (int bx = 0; bx < roi_bin_grid_w; bx++)
                        {
                            float x = roi_x1 + pw * bin_size_w + (bx + 0.5f) * bin_size_w / (float)roi_bin_grid_w;

                            if (y < -1.0 || y > h || x < -1.0 || x > w)
                            {
                                // empty
                                continue;
                            }
                            else
                            {
                                if (y <= 0) y = 0;
                                if (x <= 0) x = 0;

                                // bilinear interpolate at (x,y)
                                float v = bilinear_interpolate(ptr, w, h, x, y);
                                sum += v;
                            }
                        }
                    }
                    outptr[pw] = sum / count;
                }

                outptr += pooled_width;
            }
        }
    }

    return 0;
}